

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveInstantiation.cpp
# Opt level: O0

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
 __thiscall
Inferences::PrimitiveInstantiation::ApplicableRewritesFn::operator()
          (ApplicableRewritesFn *this,Literal *l)

{
  TermList term;
  TypedTermList t;
  bool retrieveSubstitutions;
  TermList *pTVar1;
  Term *in_RDX;
  SortId in_RSI;
  TermIndex<Indexing::TermWithoutValue> *in_RDI;
  TermList head;
  TermStack args;
  TypedTermList rhst;
  TypedTermList lhst;
  TermList rhs;
  TermList lhs;
  TermStack *in_stack_ffffffffffffff00;
  Stack<Kernel::TermList> *this_00;
  TermList *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  TermList TVar2;
  TermList local_90 [5];
  uint64_t local_68;
  TermList local_60;
  Stack<Kernel::TermList> local_58;
  Stack<Kernel::TermList> local_38;
  Term *local_18;
  
  TVar2._content = (uint64_t)in_RDI;
  local_18 = in_RDX;
  pTVar1 = Kernel::Term::nthArgument(in_RDX,0);
  local_38._end = (TermList *)pTVar1->_content;
  pTVar1 = Kernel::Term::nthArgument(local_18,1);
  local_38._cursor = (TermList *)pTVar1->_content;
  local_58._end = local_38._end;
  local_58._cursor = (TermList *)Kernel::SortHelper::getEqualityArgumentSort((Literal *)in_RDI);
  Kernel::TypedTermList::TypedTermList
            ((TypedTermList *)&local_38,(TermList)local_58._end,(SortId)local_58._cursor);
  local_60._content = (uint64_t)local_38._cursor;
  local_68 = (uint64_t)Kernel::SortHelper::getEqualityArgumentSort((Literal *)in_RDI);
  Kernel::TypedTermList::TypedTermList((TypedTermList *)&local_58,local_60,(SortId)local_68);
  Lib::Stack<Kernel::TermList>::Stack
            ((Stack<Kernel::TermList> *)
             CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             (size_t)in_stack_ffffffffffffff08);
  Kernel::TermList::TermList(local_90);
  term._content._7_1_ = in_stack_ffffffffffffff17;
  term._content._0_7_ = in_stack_ffffffffffffff10;
  ApplicativeHelper::getHeadAndArgs(term,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  retrieveSubstitutions = Kernel::TermList::isVar((TermList *)in_stack_ffffffffffffff00);
  if (retrieveSubstitutions) {
    this_00 = &local_38;
  }
  else {
    this_00 = &local_58;
  }
  t._sort._content = in_RSI._content;
  t.super_TermList._content = TVar2._content;
  Indexing::TermIndex<Indexing::TermWithoutValue>::getUnifications(in_RDI,t,retrieveSubstitutions);
  Lib::
  pvi<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermWithoutValue>>>
            ((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
              *)in_RSI._content);
  Lib::
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
  ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
                      *)this_00);
  Lib::Stack<Kernel::TermList>::~Stack(this_00);
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
            *)TVar2._content;
}

Assistant:

VirtualIterator<QueryRes<ResultSubstitutionSP, TermWithoutValue>> operator()(Literal* l)
  {
    TermList lhs = *l->nthArgument(0);
    TermList rhs = *l->nthArgument(1);
   
    TypedTermList lhst(lhs, SortHelper::getEqualityArgumentSort(l));
    TypedTermList rhst(rhs, SortHelper::getEqualityArgumentSort(l));

    TermStack args;
    TermList head;

    ApplicativeHelper::getHeadAndArgs(lhs, head, args);
     
    return pvi(_index->getUnifications((head.isVar() ? lhst : rhst)));
  }